

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O3

void __thiscall SAT::addClause(SAT *this,Lit p,Lit q)

{
  char cVar1;
  char *pcVar2;
  char cVar3;
  char cVar4;
  uint64_t d;
  anon_union_8_2_743a5d44_for_WatchElem_0 local_28;
  
  pcVar2 = (this->assigns).data;
  cVar1 = pcVar2[(uint)(p.x >> 1)];
  cVar3 = -cVar1;
  if ((p.x & 1U) == 0) {
    cVar3 = cVar1;
  }
  if (cVar3 != ::l_True.value) {
    cVar1 = pcVar2[(uint)(q.x >> 1)];
    cVar4 = -cVar1;
    if ((q.x & 1U) == 0) {
      cVar4 = cVar1;
    }
    if (cVar4 != ::l_True.value) {
      if (cVar3 == ::l_False.value) {
        p.x = q.x;
        if (cVar4 == cVar3) {
          puts("=====UNSATISFIABLE=====");
          printf("%% Top level failure!\n");
          exit(0);
        }
      }
      else if (cVar4 != ::l_False.value) {
        this->bin_clauses = this->bin_clauses + 1;
        local_28._pt = (Clause *)(((ulong)(uint)q.x << 0x20) + 1);
        vec<WatchElem>::push((this->watches).data + (p.x ^ 1),(WatchElem *)&local_28);
        local_28._pt = (Clause *)(((ulong)(uint)p.x << 0x20) + 1);
        vec<WatchElem>::push((this->watches).data + (q.x ^ 1),(WatchElem *)&local_28);
        return;
      }
      enqueue(this,p,(Reason)0x0);
      return;
    }
  }
  return;
}

Assistant:

void SAT::addClause(Lit p, Lit q) {
	if (value(p) == l_True || value(q) == l_True) {
		return;
	}
	if (value(p) == l_False && value(q) == l_False) {
		assert(false);
		TL_FAIL();
	}
	if (value(p) == l_False) {
		assert(decisionLevel() == 0);
		enqueue(q);
		return;
	}
	if (value(q) == l_False) {
		assert(decisionLevel() == 0);
		enqueue(p);
		return;
	}
	bin_clauses++;
	watches[toInt(~p)].push(q);
	watches[toInt(~q)].push(p);
}